

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O1

LIBSSH2_CHANNEL *
libssh2_channel_open_ex
          (LIBSSH2_SESSION *session,char *type,uint type_len,uint window_size,uint packet_size,
          char *msg,uint msg_len)

{
  int iVar1;
  time_t start_time;
  LIBSSH2_CHANNEL *pLVar2;
  
  if (session != (LIBSSH2_SESSION *)0x0) {
    start_time = time((time_t *)0x0);
    do {
      pLVar2 = _libssh2_channel_open
                         (session,type,type_len,window_size,packet_size,(uchar *)msg,(ulong)msg_len)
      ;
      if (session->api_block_mode == 0) {
        return pLVar2;
      }
      if (pLVar2 != (LIBSSH2_CHANNEL *)0x0) {
        return pLVar2;
      }
      iVar1 = libssh2_session_last_errno(session);
      if (iVar1 != -0x25) {
        return (LIBSSH2_CHANNEL *)0x0;
      }
      iVar1 = _libssh2_wait_socket(session,start_time);
    } while (iVar1 == 0);
  }
  return (LIBSSH2_CHANNEL *)0x0;
}

Assistant:

LIBSSH2_API LIBSSH2_CHANNEL *
libssh2_channel_open_ex(LIBSSH2_SESSION *session, const char *type,
                        unsigned int type_len,
                        unsigned int window_size, unsigned int packet_size,
                        const char *msg, unsigned int msg_len)
{
    LIBSSH2_CHANNEL *ptr;

    if(!session)
        return NULL;

    BLOCK_ADJUST_ERRNO(ptr, session,
                       _libssh2_channel_open(session, type, type_len,
                                             window_size, packet_size,
                                             (unsigned char *)msg,
                                             msg_len));
    return ptr;
}